

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testGetFullTerritoryNameLocal(char *expectedName,Territory territory,int alternative)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char local_ac [8];
  char s_1 [8];
  char s [8];
  int gotCode;
  char gotName [112];
  int expectedCode;
  int nrTests;
  int alternative_local;
  Territory territory_local;
  char *expectedName_local;
  
  uVar2 = (uint)(*expectedName != '\0');
  s._0_4_ = getFullTerritoryNameLocalUtf8(s + 4,territory,alternative);
  if ((uVar2 != 0) && (iVar3 = strcmp(expectedName,s + 4), iVar3 != 0)) {
    foundError();
    pcVar4 = getTerritoryIsoName(s_1,territory,0);
    printf("*** ERROR *** getFullTerritoryNameLocal error, expected name \'%s\', but got \'%s\' for territory %s, alternative %d\n"
           ,expectedName,s + 4,pcVar4,(ulong)(uint)alternative);
  }
  if (((uVar2 != 0) && (s._0_4_ == 0)) || ((uVar2 == 0 && (s._0_4_ != 0)))) {
    foundError();
    uVar1 = s._0_4_;
    pcVar4 = getTerritoryIsoName(local_ac,territory,0);
    printf("*** ERROR *** getFullTerritoryNameLocal error, expected return code %d, but got %d (%s) for territory %s, alternative %d\n"
           ,(ulong)uVar2,(ulong)(uint)uVar1,s + 4,pcVar4,(ulong)(uint)alternative);
  }
  return 2;
}

Assistant:

static int testGetFullTerritoryNameLocal(const char *expectedName, enum Territory territory, int alternative) {
    int nrTests = 0;
    int expectedCode = (*expectedName ? 1 : 0);
    char gotName[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1];
    int gotCode = getFullTerritoryNameLocalUtf8(gotName, territory, alternative);
    ++nrTests;
    if (expectedCode && strcmp(expectedName, gotName)) {
        char s[MAX_ISOCODE_ASCII_LEN + 1];
        foundError();
        printf("*** ERROR *** getFullTerritoryNameLocal error, expected name '%s', but got '%s' for territory %s, alternative %d\n",
               expectedName, gotName, getTerritoryIsoName(s, territory, 0), alternative);
    }
    ++nrTests;
    if ((expectedCode && !gotCode) || (!expectedCode && gotCode)) {
        char s[MAX_ISOCODE_ASCII_LEN + 1];
        foundError();
        printf("*** ERROR *** getFullTerritoryNameLocal error, expected return code %d, but got %d (%s) for territory %s, alternative %d\n",
               expectedCode, gotCode, gotName, getTerritoryIsoName(s, territory, 0), alternative);
    }
    return nrTests;
}